

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# MipsParser.cpp
# Opt level: O0

bool __thiscall
MipsParser::parseMacroParameters(MipsParser *this,Parser *parser,MipsMacroDefinition *macro)

{
  bool bVar1;
  Token *pTVar2;
  char *pcVar3;
  char *local_30;
  char *encoding;
  MipsMacroDefinition *macro_local;
  Parser *parser_local;
  MipsParser *this_local;
  
  local_30 = macro->args;
  do {
    if (*local_30 == '\0') {
      pTVar2 = Parser::peekToken(parser,0);
      if (pTVar2->type == LParen) {
        return false;
      }
      pTVar2 = Parser::nextToken(parser);
      return pTVar2->type == Separator;
    }
    pcVar3 = local_30 + 1;
    switch(*local_30) {
    case 'I':
      bVar1 = parseImmediate(this,parser,&(this->immediate).secondary.expression);
      local_30 = pcVar3;
      if (!bVar1) {
        return false;
      }
      break;
    default:
      bVar1 = matchSymbol(this,parser,*local_30);
      local_30 = pcVar3;
      if (!bVar1) {
        return false;
      }
      break;
    case 'S':
      bVar1 = parseFpuRegister(this,parser,&(this->registers).frs);
      local_30 = pcVar3;
      if (!bVar1) {
        return false;
      }
      break;
    case 'd':
      bVar1 = parseRegister(this,parser,&(this->registers).grd);
      local_30 = pcVar3;
      if (!bVar1) {
        return false;
      }
      break;
    case 'i':
      bVar1 = parseImmediate(this,parser,&(this->immediate).primary.expression);
      local_30 = pcVar3;
      if (!bVar1) {
        return false;
      }
      break;
    case 's':
      bVar1 = parseRegister(this,parser,(MipsRegisterValue *)this);
      local_30 = pcVar3;
      if (!bVar1) {
        return false;
      }
      break;
    case 't':
      bVar1 = parseRegister(this,parser,&(this->registers).grt);
      local_30 = pcVar3;
      if (!bVar1) {
        return false;
      }
    }
  } while( true );
}

Assistant:

bool MipsParser::parseMacroParameters(Parser& parser, const MipsMacroDefinition& macro)
{
	const char* encoding = macro.args;

	while (*encoding != 0)
	{
		switch (*encoding++)
		{
		case 't':	// register
			CHECK(parseRegister(parser,registers.grt));
			break;
		case 'd':	// register
			CHECK(parseRegister(parser,registers.grd));
			break;
		case 's':	// register
			CHECK(parseRegister(parser,registers.grs));
			break;
		case 'S':	// register
			CHECK(parseFpuRegister(parser,registers.frs));
			break;
		case 'i':	// primary immediate
			CHECK(parseImmediate(parser,immediate.primary.expression));
			break;
		case 'I':	// secondary immediate
			CHECK(parseImmediate(parser,immediate.secondary.expression));
			break;
		default:
			CHECK(matchSymbol(parser,*(encoding-1)));
			break;
		}
	}

	// lw rx,imm is a prefix of lw rx,imm(ry)
	if (parser.peekToken().type == TokenType::LParen)
		return false;

	// the next token has to be a separator, else the parameters aren't
	// completely parsed
	return parser.nextToken().type == TokenType::Separator;
}